

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_pool_impl.cpp
# Opt level: O1

FileHandle __thiscall
libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::open_file
          (file_pool_impl<libtorrent::aux::file_view_entry> *this,storage_index_t st,string *p,
          file_index_t file_index,file_storage *fs,open_mode_t m)

{
  header_holder_type *phVar1;
  sequenced_index_node_trampoline<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
  *psVar2;
  node_ptr plVar3;
  pointer psVar4;
  unsigned_long uVar5;
  type tVar6;
  file_id file_key_00;
  iterator x;
  ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>_>
  *poVar7;
  final_node_type *x_00;
  final_node_type *pfVar8;
  undefined4 in_register_0000000c;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  undefined4 in_register_00000034;
  file_pool_impl<libtorrent::aux::file_view_entry> *this_00;
  undefined4 in_register_0000008c;
  pair<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>_>_*,_bool>
  pVar10;
  FileHandle FVar11;
  open_mode_t in_stack_00000008;
  unique_lock<std::mutex> l;
  file_id file_key;
  opening_file_entry ofe;
  FileHandle defer_destruction2;
  file_view_entry e;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_180;
  unique_lock<std::mutex> local_178;
  pair<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
  local_168;
  file_pool_impl<libtorrent::aux::file_view_entry> *local_160;
  FileHandle local_158;
  undefined1 local_148 [16];
  strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void> sStack_138;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> sStack_134;
  size_traits local_128;
  undefined1 auStack_120 [40];
  storage_error asStack_f8 [2];
  FileHandle local_b8 [4];
  file_view_entry local_70;
  storage_error local_48;
  
  local_b8[1].super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(in_register_0000008c,m.m_val);
  this_00 = (file_pool_impl<libtorrent::aux::file_view_entry> *)
            CONCAT44(in_register_00000034,st.m_val);
  local_b8[0].super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_b8[0].super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_178._M_device = &this_00->m_mutex;
  local_178._M_owns = false;
  ::std::unique_lock<std::mutex>::lock(&local_178);
  local_178._M_owns = true;
  local_168.first.m_val = (uint)p;
  local_168.second.m_val = (int)fs;
  x = boost::multi_index::detail::
      ordered_index_impl<boost::multi_index::member<libtorrent::aux::file_view_entry,std::pair<libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>,&libtorrent::aux::file_view_entry::key>,std::less<std::pair<libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>>,boost::multi_index::detail::nth_layer<1,libtorrent::aux::file_view_entry,boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_view_entry,std::pair<libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>,&libtorrent::aux::file_view_entry::key>,mpl_::na,mpl_::na>,boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<libtorrent::aux::file_view_entry>>,boost::mpl::vector0<mpl_::na>,boost::multi_index::detail::ordered_unique_tag,boost::multi_index::detail::null_augment_policy>
      ::
      find<std::pair<libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>>
                ((ordered_index_impl<boost::multi_index::member<libtorrent::aux::file_view_entry,std::pair<libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>,&libtorrent::aux::file_view_entry::key>,std::less<std::pair<libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>>,boost::multi_index::detail::nth_layer<1,libtorrent::aux::file_view_entry,boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_view_entry,std::pair<libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>,&libtorrent::aux::file_view_entry::key>,mpl_::na,mpl_::na>,boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<libtorrent::aux::file_view_entry>>,boost::mpl::vector0<mpl_::na>,boost::multi_index::detail::ordered_unique_tag,boost::multi_index::detail::null_augment_policy>
                  *)&(this_00->m_files).super_type,&local_168);
  if (x.node == (this_00->m_files).
                super_header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>_>_*,_boost::multi_index::multi_index_container<libtorrent::aux::file_view_entry,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_view_entry,_std::pair<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_&libtorrent::aux::file_view_entry::key>,_mpl_::na,_mpl_::na>,_boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<libtorrent::aux::file_view_entry>_>_>
                .member) {
    phVar1 = &(this_00->m_opening_files).super_type.data_.root_plus_size_.m_header;
    plVar3 = (this_00->m_opening_files).super_type.data_.root_plus_size_.m_header.super_node.next_;
    while ((plVar3 != &phVar1->super_node &&
           (((*(uint *)&plVar3[1].next_ != local_168.first.m_val ||
             (*(int *)((long)&plVar3[1].next_ + 4) != local_168.second.m_val)) ||
            (((in_stack_00000008.m_val & 1) != 0 && (((ulong)plVar3[1].prev_ & 1) == 0))))))) {
      plVar3 = plVar3->next_;
    }
    if (plVar3 == &phVar1->super_node) goto LAB_001c0530;
    local_148._0_8_ = (reference)0x0;
    local_148._8_4_ = 0;
    local_148._12_4_ = 0;
    ::std::condition_variable::condition_variable((condition_variable *)&sStack_138);
    auStack_120._24_8_ = (element_type *)0x0;
    auStack_120._32_5_ = 0;
    auStack_120._37_3_ = 0;
    asStack_f8[0].ec.val_ = 0;
    asStack_f8[0].ec.failed_ = false;
    asStack_f8[0].ec.cat_ =
         &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
    asStack_f8[0]._16_3_ = 0xffffff;
    asStack_f8[0].operation = unknown;
    boost::intrusive::
    list_impl<boost::intrusive::mhtraits<libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::wait_open_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::wait_open_entry::list_hook>,_unsigned_long,_true,_void>
    ::push_back((list_impl<boost::intrusive::mhtraits<libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::wait_open_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::wait_open_entry::list_hook>,_unsigned_long,_true,_void>
                 *)(plVar3 + 2),(reference)local_148);
    do {
      ::std::condition_variable::wait((unique_lock *)&sStack_138);
      if ((element_type *)auStack_120._24_8_ != (element_type *)0x0) break;
    } while (asStack_f8[0].ec.val_ == 0);
    if (asStack_f8[0].ec.val_ != 0) {
      throw_ex<libtorrent::storage_error,libtorrent::storage_error&>(asStack_f8);
    }
    *(undefined8 *)this = auStack_120._24_8_;
    uVar5 = CONCAT35(auStack_120._37_3_,auStack_120._32_5_);
    (this->m_opening_files).super_type.data_.root_plus_size_.super_size_traits.size_ = uVar5;
    if (uVar5 != 0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(uVar5 + 8) = *(int *)(uVar5 + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(uVar5 + 8) = *(int *)(uVar5 + 8) + 1;
      }
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        CONCAT35(auStack_120._37_3_,auStack_120._32_5_) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 CONCAT35(auStack_120._37_3_,auStack_120._32_5_));
    }
    ::std::condition_variable::~condition_variable((condition_variable *)&sStack_138);
    if ((reference)local_148._0_8_ != (reference)local_148 &&
        (reference)local_148._0_8_ != (reference)0x0) goto LAB_001c09c2;
  }
  else {
LAB_001c0530:
    if ((x.node == (this_00->m_files).
                   super_header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>_>_*,_boost::multi_index::multi_index_container<libtorrent::aux::file_view_entry,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_view_entry,_std::pair<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_&libtorrent::aux::file_view_entry::key>,_mpl_::na,_mpl_::na>,_boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<libtorrent::aux::file_view_entry>_>_>
                   .member) ||
       (((in_stack_00000008.m_val & 1) != 0 &&
        ((((x.node)->
          super_sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
          ).
          super_index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>
          .super_pod_value_holder<libtorrent::aux::file_view_entry>.space.data_.buf[0x20] & 1U) == 0
        )))) {
      local_160 = this;
      if ((int)(this_00->m_files).node_count < this_00->m_size + -1) {
        local_180 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        remove_oldest((file_pool_impl<libtorrent::aux::file_view_entry> *)local_148,
                      (unique_lock<std::mutex> *)this_00);
        local_180 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    CONCAT44(local_148._12_4_,local_148._8_4_);
      }
      local_128.size_ = 0;
      local_148._0_8_ = (reference)0x0;
      local_148._8_4_ = 0;
      local_148._12_4_ = 0;
      sStack_138.m_val = local_168.first.m_val;
      sStack_134.m_val = local_168.second.m_val;
      auStack_120._0_8_ = auStack_120;
      auStack_120._8_8_ = auStack_120;
      boost::intrusive::
      list_impl<boost::intrusive::mhtraits<libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::opening_file_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::opening_file_entry::list_hook>,_unsigned_long,_true,_void>
      ::push_back(&(this_00->m_opening_files).super_type,(reference)local_148);
      ::std::unique_lock<std::mutex>::unlock(&local_178);
      file_key_00.second.m_val = local_168.second.m_val;
      file_key_00.first.m_val = local_168.first.m_val;
      open_file_impl(&local_70,this_00,(string *)CONCAT44(in_register_0000000c,file_index.m_val),
                     (file_index_t)(int)fs,
                     (file_storage *)
                     local_b8[1].
                     super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi,in_stack_00000008,file_key_00);
      ::std::unique_lock<std::mutex>::lock(&local_178);
      pVar10 = boost::multi_index::
               multi_index_container<libtorrent::aux::file_view_entry,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_view_entry,_std::pair<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_&libtorrent::aux::file_view_entry::key>,_mpl_::na,_mpl_::na>,_boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<libtorrent::aux::file_view_entry>_>
               ::insert_<boost::multi_index::detail::lvalue_tag>(&this_00->m_files,&local_70);
      x_00 = pVar10.first;
      if (pVar10.second == false) {
        if (((in_stack_00000008.m_val & 1) != 0) &&
           (((x_00->
             super_sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
             ).
             super_index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>
             .super_pod_value_holder<libtorrent::aux::file_view_entry>.space.data_.buf[0x20] & 1U)
            == 0)) {
          local_48.ec._0_8_ = local_b8;
          local_48.ec.cat_ = (error_category *)&local_70;
          boost::multi_index::
          multi_index_container<libtorrent::aux::file_view_entry,boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_view_entry,std::pair<libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>,&libtorrent::aux::file_view_entry::key>,mpl_::na,mpl_::na>,boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<libtorrent::aux::file_view_entry>>
          ::
          modify_<libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::open_file(libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,std::__cxx11::string_const&,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,libtorrent::file_storage_const&,libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::aux::open_mode_tag,void>)::_lambda(libtorrent::aux::file_view_entry&)_2_>
                    ((multi_index_container<libtorrent::aux::file_view_entry,boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_view_entry,std::pair<libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>,&libtorrent::aux::file_view_entry::key>,mpl_::na,mpl_::na>,boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<libtorrent::aux::file_view_entry>>
                      *)&this_00->m_files,(anon_class_16_2_6e076f23 *)&local_48,x_00);
        }
        psVar4 = (((this_00->m_files).
                   super_header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>_>_*,_boost::multi_index::multi_index_container<libtorrent::aux::file_view_entry,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_view_entry,_std::pair<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_&libtorrent::aux::file_view_entry::key>,_mpl_::na,_mpl_::na>,_boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<libtorrent::aux::file_view_entry>_>_>
                  .member)->
                 super_sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
                 ).
                 super_sequenced_index_node_trampoline<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
                 .super_sequenced_index_node_impl<std::allocator<char>_>.next_;
        pfVar8 = (final_node_type *)&psVar4[-3].next_;
        if (psVar4 == (pointer)0x0) {
          pfVar8 = (final_node_type *)0x0;
        }
        if (x_00 != pfVar8) {
          psVar2 = &(pfVar8->
                    super_sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
                    ).
                    super_sequenced_index_node_trampoline<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
          ;
          ((pfVar8->
           super_sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
           ).
           super_sequenced_index_node_trampoline<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
           .super_sequenced_index_node_impl<std::allocator<char>_>.prior_)->next_ =
               (pfVar8->
               super_sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
               ).
               super_sequenced_index_node_trampoline<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
               .super_sequenced_index_node_impl<std::allocator<char>_>.next_;
          ((pfVar8->
           super_sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
           ).
           super_sequenced_index_node_trampoline<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
           .super_sequenced_index_node_impl<std::allocator<char>_>.next_)->prior_ =
               (pfVar8->
               super_sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
               ).
               super_sequenced_index_node_trampoline<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
               .super_sequenced_index_node_impl<std::allocator<char>_>.prior_;
          (pfVar8->
          super_sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
          ).
          super_sequenced_index_node_trampoline<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
          .super_sequenced_index_node_impl<std::allocator<char>_>.prior_ =
               (x_00->
               super_sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
               ).
               super_sequenced_index_node_trampoline<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
               .super_sequenced_index_node_impl<std::allocator<char>_>.prior_;
          (pfVar8->
          super_sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
          ).
          super_sequenced_index_node_trampoline<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
          .super_sequenced_index_node_impl<std::allocator<char>_>.next_ =
               &(x_00->
                super_sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
                ).
                super_sequenced_index_node_trampoline<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
                .super_sequenced_index_node_impl<std::allocator<char>_>;
          (x_00->
          super_sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
          ).
          super_sequenced_index_node_trampoline<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
          .super_sequenced_index_node_impl<std::allocator<char>_>.prior_ =
               &psVar2->super_sequenced_index_node_impl<std::allocator<char>_>;
          ((pfVar8->
           super_sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
           ).
           super_sequenced_index_node_trampoline<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
           .super_sequenced_index_node_impl<std::allocator<char>_>.prior_)->next_ =
               &psVar2->super_sequenced_index_node_impl<std::allocator<char>_>;
        }
      }
      local_158.super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = *(element_type **)
              ((long)&(x_00->
                      super_sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
                      ).
                      super_index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>
                      .super_pod_value_holder<libtorrent::aux::file_view_entry>.space.data_ + 8);
      local_158.super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
            ((long)&(x_00->
                    super_sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
                    ).
                    super_index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>
                    .super_pod_value_holder<libtorrent::aux::file_view_entry>.space.data_ + 0x10);
      if (local_158.super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_158.super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_158.
                super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_158.super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_158.
                super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      local_48.ec._0_8_ = (ulong)(uint3)local_48.ec._5_3_ << 0x28;
      local_48.ec.cat_ =
           &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
      local_48._16_3_ = 0xffffff;
      local_48.operation = unknown;
      notify_file_open(this_00,(opening_file_entry *)local_148,&local_158,&local_48);
      if (local_158.super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_158.
                   super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      *(undefined8 *)local_160 =
           *(undefined8 *)
            ((long)&(x_00->
                    super_sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
                    ).
                    super_index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>
                    .super_pod_value_holder<libtorrent::aux::file_view_entry>.space.data_ + 8);
      uVar5 = *(unsigned_long *)
               ((long)&(x_00->
                       super_sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
                       ).
                       super_index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>
                       .super_pod_value_holder<libtorrent::aux::file_view_entry>.space.data_ + 0x10)
      ;
      (local_160->m_opening_files).super_type.data_.root_plus_size_.super_size_traits.size_ = uVar5;
      if (uVar5 != 0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(uVar5 + 8) = *(int *)(uVar5 + 8) + 1;
          UNLOCK();
        }
        else {
          *(int *)(uVar5 + 8) = *(int *)(uVar5 + 8) + 1;
        }
      }
      if (local_70.mapping.
          super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_70.mapping.
                   super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      while ((undefined1 *)auStack_120._0_8_ != auStack_120) {
        tVar6 = *(type *)auStack_120._0_8_;
        *(undefined8 *)auStack_120._0_8_ = 0;
        *(undefined8 *)(auStack_120._0_8_ + 8) = 0;
        auStack_120._0_8_ = tVar6;
      }
      local_128.size_ = 0;
      auStack_120._0_8_ = (type)0x0;
      auStack_120._8_8_ = 0;
      this = local_160;
      if ((reference)local_148._0_8_ != (reference)local_148 &&
          (reference)local_148._0_8_ != (reference)0x0) {
LAB_001c09c2:
        __assert_fail("!hook.is_linked()","/usr/include/boost/intrusive/detail/generic_hook.hpp",
                      0x30,
                      "void boost::intrusive::detail::destructor_impl(Hook &, detail::link_dispatch<safe_link>) [Hook = boost::intrusive::generic_hook<boost::intrusive::CircularListAlgorithms, boost::intrusive::list_node_traits<void *>, boost::intrusive::member_tag, boost::intrusive::safe_link, boost::intrusive::NoBaseHookId>]"
                     );
      }
      goto LAB_001c0984;
    }
    boost::multi_index::
    multi_index_container<libtorrent::aux::file_view_entry,boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_view_entry,std::pair<libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>,&libtorrent::aux::file_view_entry::key>,mpl_::na,mpl_::na>,boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<libtorrent::aux::file_view_entry>>
    ::
    modify_<libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::open_file(libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,std::__cxx11::string_const&,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,libtorrent::file_storage_const&,libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::aux::open_mode_tag,void>)::_lambda(libtorrent::aux::file_view_entry&)_1_>
              ((multi_index_container<libtorrent::aux::file_view_entry,boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_view_entry,std::pair<libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>,&libtorrent::aux::file_view_entry::key>,mpl_::na,mpl_::na>,boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<libtorrent::aux::file_view_entry>>
                *)&this_00->m_files,(anon_class_1_0_00000001 *)local_148,x.node);
    psVar4 = (((this_00->m_files).
               super_header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>_>_*,_boost::multi_index::multi_index_container<libtorrent::aux::file_view_entry,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_view_entry,_std::pair<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_&libtorrent::aux::file_view_entry::key>,_mpl_::na,_mpl_::na>,_boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<libtorrent::aux::file_view_entry>_>_>
              .member)->
             super_sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
             ).
             super_sequenced_index_node_trampoline<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
             .super_sequenced_index_node_impl<std::allocator<char>_>.next_;
    poVar7 = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>_>
              *)&psVar4[-3].next_;
    if (psVar4 == (pointer)0x0) {
      poVar7 = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>_>
                *)0x0;
    }
    if (x.node != poVar7) {
      psVar2 = &(poVar7->
                super_sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
                ).
                super_sequenced_index_node_trampoline<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
      ;
      ((poVar7->
       super_sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
       ).
       super_sequenced_index_node_trampoline<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
       .super_sequenced_index_node_impl<std::allocator<char>_>.prior_)->next_ =
           (poVar7->
           super_sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
           ).
           super_sequenced_index_node_trampoline<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
           .super_sequenced_index_node_impl<std::allocator<char>_>.next_;
      ((poVar7->
       super_sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
       ).
       super_sequenced_index_node_trampoline<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
       .super_sequenced_index_node_impl<std::allocator<char>_>.next_)->prior_ =
           (poVar7->
           super_sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
           ).
           super_sequenced_index_node_trampoline<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
           .super_sequenced_index_node_impl<std::allocator<char>_>.prior_;
      (poVar7->
      super_sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
      ).
      super_sequenced_index_node_trampoline<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
      .super_sequenced_index_node_impl<std::allocator<char>_>.prior_ =
           ((x.node)->
           super_sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
           ).
           super_sequenced_index_node_trampoline<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
           .super_sequenced_index_node_impl<std::allocator<char>_>.prior_;
      (poVar7->
      super_sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
      ).
      super_sequenced_index_node_trampoline<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
      .super_sequenced_index_node_impl<std::allocator<char>_>.next_ =
           &((x.node)->
            super_sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
            ).
            super_sequenced_index_node_trampoline<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
            .super_sequenced_index_node_impl<std::allocator<char>_>;
      ((x.node)->
      super_sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
      ).
      super_sequenced_index_node_trampoline<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
      .super_sequenced_index_node_impl<std::allocator<char>_>.prior_ =
           &psVar2->super_sequenced_index_node_impl<std::allocator<char>_>;
      ((poVar7->
       super_sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
       ).
       super_sequenced_index_node_trampoline<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
       .super_sequenced_index_node_impl<std::allocator<char>_>.prior_)->next_ =
           &psVar2->super_sequenced_index_node_impl<std::allocator<char>_>;
    }
    *(undefined8 *)this =
         *(undefined8 *)
          ((long)&((x.node)->
                  super_sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
                  ).
                  super_index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>
                  .super_pod_value_holder<libtorrent::aux::file_view_entry>.space.data_ + 8);
    uVar5 = *(unsigned_long *)
             ((long)&((x.node)->
                     super_sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
                     ).
                     super_index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>
                     .super_pod_value_holder<libtorrent::aux::file_view_entry>.space.data_ + 0x10);
    (this->m_opening_files).super_type.data_.root_plus_size_.super_size_traits.size_ = uVar5;
    if (uVar5 != 0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(uVar5 + 8) = *(int *)(uVar5 + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(uVar5 + 8) = *(int *)(uVar5 + 8) + 1;
      }
    }
  }
  local_180 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_001c0984:
  ::std::unique_lock<std::mutex>::~unique_lock(&local_178);
  _Var9._M_pi = extraout_RDX;
  if (local_b8[0].super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8[0].
               super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var9._M_pi = extraout_RDX_00;
  }
  if (local_180 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_180);
    _Var9._M_pi = extraout_RDX_01;
  }
  FVar11.super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var9._M_pi;
  FVar11.super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (FileHandle)
         FVar11.super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

typename file_pool_impl<FileEntry>::FileHandle
	file_pool_impl<FileEntry>::open_file(storage_index_t st, std::string const& p
		, file_index_t const file_index, file_storage const& fs
		, open_mode_t const m
#if TORRENT_HAVE_MAP_VIEW_OF_FILE
		, std::shared_ptr<std::mutex> open_unmap_lock
#endif
		)
	{
		// potentially used to hold a reference to a file object that's
		// about to be destructed. If we have such object we assign it to
		// this member to be destructed after we release the std::mutex. On some
		// operating systems (such as OSX) closing a file may take a long
		// time. We don't want to hold the std::mutex for that.
		FileHandle defer_destruction1;
		FileHandle defer_destruction2;

		std::unique_lock<std::mutex> l(m_mutex);

		TORRENT_ASSERT(is_complete(p));
		auto& key_view = m_files.template get<0>();
		file_id const file_key{st, file_index};
		auto i = key_view.find(file_key);

		if (i == key_view.end())
		{
			auto opening = std::find_if(m_opening_files.begin(), m_opening_files.end()
				, [&file_key, m](opening_file_entry const& oe) {
					return oe.file_key == file_key
						&& (!(m & open_mode::write) || (oe.mode & open_mode::write));
				});
			if (opening != m_opening_files.end())
			{
				wait_open_entry woe;
				opening->waiters.push_back(woe);

#if TRACE_FILE_POOL
				std::cout << std::this_thread::get_id() << " waiting for: ("
					<< file_key.first << ", " << file_key.second << ")\n";
#endif
				do {
					woe.cond.wait(l);
				} while (!woe.mapping && !woe.error);
				if (woe.error)
				{
#if TRACE_FILE_POOL
					std::cout << std::this_thread::get_id() << " open failed: ("
						<< file_key.first << ", " << file_key.second
						<< "): " << woe.error.ec << std::endl;
#endif
					throw_ex<storage_error>(woe.error);
				}

#if TRACE_FILE_POOL
				std::cout << std::this_thread::get_id() << " file opened: ("
					<< file_key.first << ", " << file_key.second << ")\n";
#endif
				return woe.mapping;
			}
		}

		// make sure the write bit is set if we asked for it
		// it's OK to use a read-write file if we just asked for read. But if
		// we asked for write, the file we serve back must be opened in write
		// mode
		if (i != key_view.end()
			&& (!(m & open_mode::write) || (i->mode & open_mode::write)))
		{
			key_view.modify(i, [&](FileEntry& e)
			{
				e.last_use = aux::time_now();
			});

			auto& lru_view = m_files. template get<1>();
			lru_view.relocate(m_files. template project<1>(i), lru_view.begin());

			return i->mapping;
		}

		if (int(m_files.size()) >= m_size - 1)
		{
			// the file cache is at its maximum size, close
			// the least recently used file
			defer_destruction1 = remove_oldest(l);
		}

		opening_file_entry ofe;
		ofe.file_key = file_key;
		ofe.mode = m;
		m_opening_files.push_back(ofe);

#if TRACE_FILE_POOL
		std::cout << std::this_thread::get_id() << " opening file: ("
			<< file_key.first << ", " << file_key.second << ")\n";
#endif

		l.unlock();

		try
		{
			FileEntry e = open_file_impl(p, file_index, fs, m, file_key
#if TORRENT_HAVE_MAP_VIEW_OF_FILE
				, open_unmap_lock
#endif
				);

			l.lock();

			// there's an edge case where two threads are racing to insert a newly
			// opened file, one thread is opening a file for writing and the other
			// fore reading. If the reading thread wins, it's important that the
			// thread opening for writing still overwrites the file in the pool,
			// since a file opened for reading and writing can be used for both.
			// So, we can't move e in here, because we may need it again of the
			// insertion failed.
			// if the insertion failed, check to see if we can use the existing
			// entry. If not, overwrite it with the newly opened file ``e``.
			bool added;
			std::tie(i, added) = key_view.insert(e);
			if (added == false)
			{
				// this is the case where this file was already in the pool. Make
				// sure we can use it. If we asked for write mode, it must have been
				// opened in write mode too.
				TORRENT_ASSERT(i != key_view.end());

				if ((m & open_mode::write) && !(i->mode & open_mode::write))
				{
					key_view.modify(i, [&](FileEntry& fe)
					{
						defer_destruction2 = std::move(fe.mapping);
						fe = std::move(e);
					});
				}

				auto& lru_view = m_files.template get<1>();
				lru_view.relocate(m_files. template project<1>(i), lru_view.begin());
			}
			notify_file_open(ofe, i->mapping, storage_error());
			return i->mapping;
		}
		catch (storage_error const& se)
		{
			if (!l.owns_lock()) l.lock();
			notify_file_open(ofe, {}, se);
			throw;
		}
		catch (std::bad_alloc const&)
		{
			if (!l.owns_lock()) l.lock();
			notify_file_open(ofe, {}, storage_error(
				errors::no_memory, file_index, operation_t::file_open));
			throw;
		}
		catch (boost::system::system_error const& se)
		{
			if (!l.owns_lock()) l.lock();
			notify_file_open(ofe, {}, storage_error(
				se.code(), file_index, operation_t::file_open));
			throw;
		}
		catch (...)
		{
			if (!l.owns_lock()) l.lock();
			notify_file_open(ofe, {}, storage_error(
				errors::no_memory, file_index, operation_t::file_open));
			throw;
		}
	}